

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O0

int __thiscall
BlockDevice::ScsiCmd
          (BlockDevice *this,int fd,uint8_t *cmd,int cmd_len,void *data,int data_len,bool read)

{
  undefined4 local_c0;
  int ret;
  sg_io_hdr io_hdr;
  uint8_t sense [32];
  bool read_local;
  int data_len_local;
  void *data_local;
  int cmd_len_local;
  uint8_t *cmd_local;
  int fd_local;
  BlockDevice *this_local;
  
  memset(&local_c0,0,0x58);
  local_c0 = 0x53;
  io_hdr.interface_id._0_1_ = (undefined1)cmd_len;
  ret = -2;
  if (read) {
    ret = -3;
  }
  io_hdr.cmdp = (uchar *)&io_hdr.info;
  io_hdr.interface_id._1_1_ = 0x20;
  io_hdr.sbp._0_4_ = 5000;
  io_hdr.dxfer_direction = data_len;
  io_hdr._8_8_ = data;
  io_hdr.dxferp = cmd;
  this_local._4_4_ = ioctl(fd,0x2285,&local_c0);
  if (-1 < this_local._4_4_) {
    if ((read) && ((io_hdr.resid & 1U) != 0)) {
      this_local._4_4_ = -0x26;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int BlockDevice::ScsiCmd(int fd, const uint8_t* cmd, int cmd_len, void* data, int data_len, bool read)
{
#if defined(HAVE_SCSI_SCSI_H) && defined(HAVE_SCSI_SG_H)
    uint8_t sense[32];

    struct sg_io_hdr io_hdr = {};
    io_hdr.interface_id = 'S';
    io_hdr.cmdp = const_cast<uint8_t*>(cmd);
    io_hdr.cmd_len = cmd_len;
    io_hdr.dxferp = data;
    io_hdr.dxfer_len = data_len;
    io_hdr.dxfer_direction = read ? SG_DXFER_FROM_DEV : SG_DXFER_TO_DEV;
    io_hdr.sbp = sense;
    io_hdr.mx_sb_len = sizeof(sense);
    io_hdr.timeout = 5000;

    auto ret = ioctl(fd, SG_IO, &io_hdr);
    if (ret < 0)
        return ret;

    if (read && (io_hdr.info & SG_INFO_OK_MASK) != SG_INFO_OK)
        return -ENOSYS;

    return 0;
#else
    (void)fd; (void)cmd; (void)cmd_len; (void)data; (void)data_len; (void)read;
    return -ENOTSUP;
#endif // HAVE_SCSI_SCSI_H && HAVE_SCSI_SG_H
}